

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeTryTable
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name label,Signature sig,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *tags,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *labels,
          vector<bool,_std::allocator<bool>_> *isRefs)

{
  undefined8 *puVar1;
  Index *pIVar2;
  undefined1 uVar3;
  TryTable *trytable;
  _Variant_storage<false,_wasm::Name,_wasm::Err> *p_Var4;
  MixedArena *this_00;
  ulong size;
  Index *pIVar5;
  Name item;
  Name label_00;
  undefined1 local_d8 [8];
  Result<wasm::Name> name;
  Result<wasm::Name> _val;
  undefined8 local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  undefined8 uStack_70;
  uintptr_t local_68;
  Type local_60;
  char *local_58;
  size_t local_50;
  IRBuilder *local_48;
  ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *local_40;
  Result<wasm::Ok> *local_38;
  
  local_68 = (uintptr_t)sig.results.id;
  local_60 = sig.params.id;
  local_58 = label.super_IString.str._M_str;
  local_50 = label.super_IString.str._M_len;
  this_00 = &this->wasm->allocator;
  local_48 = this;
  local_38 = __return_storage_ptr__;
  trytable = (TryTable *)MixedArena::allocSpace(this_00,0x98,8);
  (trytable->super_SpecificExpression<(wasm::Expression::Id)53>).super_Expression._id = TryTableId;
  (trytable->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data =
       (Name *)0x0;
  (trytable->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements = 0;
  (trytable->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.allocatedElements
       = 0;
  (trytable->catchTags).allocator = this_00;
  local_40 = &(trytable->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>;
  (trytable->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data =
       (Name *)0x0;
  (trytable->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements = 0
  ;
  (trytable->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
  allocatedElements = 0;
  (trytable->catchDests).allocator = this_00;
  (trytable->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>.data = (bool *)0x0;
  (trytable->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>.usedElements = 0;
  (trytable->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>.allocatedElements = 0;
  (trytable->catchRefs).allocator = this_00;
  (trytable->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.data =
       (Type *)0x0;
  (trytable->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.usedElements = 0;
  (trytable->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.allocatedElements
       = 0;
  (trytable->sentTypes).allocator = this_00;
  (trytable->super_SpecificExpression<(wasm::Expression::Id)53>).super_Expression.type.id = local_68
  ;
  ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name>::
  set<std::vector<wasm::Name,std::allocator<wasm::Name>>>
            ((ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name> *)&trytable->catchTags,tags);
  ArenaVectorBase<ArenaVector<bool>,bool>::set<std::vector<bool,std::allocator<bool>>>
            ((ArenaVectorBase<ArenaVector<bool>,bool> *)&trytable->catchRefs,isRefs);
  size = (long)(labels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(labels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start >> 2;
  if ((trytable->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
      allocatedElements < size) {
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::reallocate(local_40,size);
  }
  pIVar5 = (labels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pIVar2 = (labels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pIVar5 != pIVar2) {
    do {
      getLabelName((Result<wasm::Name> *)local_d8,local_48,*pIVar5,false);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Name,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)
                 ((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),
                 (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)local_d8);
      uVar3 = _val.val.super__Variant_base<wasm::Name,_wasm::Err>.
              super__Move_assign_alias<wasm::Name,_wasm::Err>.
              super__Copy_assign_alias<wasm::Name,_wasm::Err>.
              super__Move_ctor_alias<wasm::Name,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
              super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_;
      if (_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\x01') {
        _val.val.super__Variant_base<wasm::Name,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_ = &local_78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                           super__Move_assign_alias<wasm::Name,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),
                   name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                   super__Move_assign_alias<wasm::Name,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_,
                   _val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                   super__Move_assign_alias<wasm::Name,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._M_first._M_storage.
                   super_IString.str._M_len +
                   name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                   super__Move_assign_alias<wasm::Name,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_);
        puVar1 = (undefined8 *)
                 ((long)&(local_38->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(local_38->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
        if ((undefined1 *)
            _val.val.super__Variant_base<wasm::Name,_wasm::Err>.
            super__Move_assign_alias<wasm::Name,_wasm::Err>.
            super__Copy_assign_alias<wasm::Name,_wasm::Err>.
            super__Move_ctor_alias<wasm::Name,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
            super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_ == &local_78) {
          *puVar1 = CONCAT71(uStack_77,local_78);
          *(undefined8 *)
           ((long)&(local_38->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_70;
        }
        else {
          *(undefined8 *)
           &(local_38->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
               _val.val.super__Variant_base<wasm::Name,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
               super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_;
          *(ulong *)((long)&(local_38->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
               CONCAT71(uStack_77,local_78);
        }
        *(undefined8 *)
         ((long)&(local_38->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_80;
        local_78 = 0;
        *(__index_type *)
         ((long)&(local_38->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        _val.val.super__Variant_base<wasm::Name,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_ = &local_78;
        std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)
                   ((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                           super__Move_assign_alias<wasm::Name,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)local_d8);
        return local_38;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)
                 ((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
      p_Var4 = (_Variant_storage<false,_wasm::Name,_wasm::Err> *)0x0;
      if (name.val.super__Variant_base<wasm::Name,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\0') {
        p_Var4 = (_Variant_storage<false,_wasm::Name,_wasm::Err> *)local_d8;
      }
      item.super_IString.str._M_str = (p_Var4->_M_u)._M_first._M_storage.super_IString.str._M_str;
      item.super_IString.str._M_len = (size_t)local_d8;
      ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::push_back(local_40,item);
      std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)local_d8);
      if (uVar3 == '\x01') {
        return local_38;
      }
      pIVar5 = pIVar5 + 1;
    } while (pIVar5 != pIVar2);
  }
  label_00.super_IString.str._M_str = local_58;
  label_00.super_IString.str._M_len = local_50;
  visitTryTableStart(local_38,local_48,trytable,label_00,local_60);
  return local_38;
}

Assistant:

Result<> IRBuilder::makeTryTable(Name label,
                                 Signature sig,
                                 const std::vector<Name>& tags,
                                 const std::vector<Index>& labels,
                                 const std::vector<bool>& isRefs) {
  auto* trytable = wasm.allocator.alloc<TryTable>();
  trytable->type = sig.results;
  trytable->catchTags.set(tags);
  trytable->catchRefs.set(isRefs);
  trytable->catchDests.reserve(labels.size());
  for (auto label : labels) {
    auto name = getLabelName(label);
    CHECK_ERR(name);
    trytable->catchDests.push_back(*name);
  }
  return visitTryTableStart(trytable, label, sig.params);
}